

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O2

void __thiscall DSeqActorNode::Destroy(DSeqActorNode *this)

{
  AActor *actor;
  
  if (-1 < (this->super_DSeqNode).m_StopSound) {
    actor = GC::ReadBarrier<AActor>((AActor **)&this->m_Actor);
    S_StopSound(actor,4);
    if (0 < (this->super_DSeqNode).m_StopSound) {
      (*(this->super_DSeqNode).super_DObject._vptr_DObject[7])(this,0);
    }
  }
  DSeqNode::Destroy(&this->super_DSeqNode);
  return;
}

Assistant:

void DSeqActorNode::Destroy ()
{
	if (m_StopSound >= 0)
		S_StopSound (m_Actor, CHAN_BODY);
	if (m_StopSound >= 1)
		MakeSound (0, m_StopSound);
	Super::Destroy();
}